

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::optimize_read_modify_write
          (CompilerGLSL *this,SPIRType *type,string *lhs,string *rhs)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expr;
  char bop;
  size_type op;
  size_type index;
  string *rhs_local;
  string *lhs_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  uVar2 = ::std::__cxx11::string::size();
  lVar3 = ::std::__cxx11::string::size();
  if (uVar2 < lVar3 + 3U) {
    this_local._7_1_ = false;
  }
  else if ((type->vecsize < 2) || (type->columns < 2)) {
    lVar3 = ::std::__cxx11::string::find((string *)rhs,(ulong)lhs);
    if (lVar3 == 0) {
      ::std::__cxx11::string::size();
      lVar3 = ::std::__cxx11::string::find_first_of((char *)rhs,0x680b85);
      lVar4 = ::std::__cxx11::string::size();
      if (lVar3 == lVar4 + 1) {
        pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)rhs);
        if (*pcVar5 == ' ') {
          pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)rhs);
          expr.field_2._M_local_buf[0xf] = *pcVar5;
          ::std::__cxx11::string::size();
          ::std::__cxx11::string::substr((ulong)local_68,(ulong)rhs);
          bVar1 = needs_enclose_expression((string *)local_68);
          if (bVar1) {
            this_local._7_1_ = false;
          }
          else {
            if (((expr.field_2._M_local_buf[0xf] == '+') || (expr.field_2._M_local_buf[0xf] == '-'))
               && ((bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_68,"1"), bVar1 ||
                   (((bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_68,"uint(1)"), bVar1 ||
                     (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_68,"1u"), bVar1)) ||
                    (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_68,"int(1u)"), bVar1)))))) {
              statement<std::__cxx11::string_const&,char&,char&,char_const(&)[2]>
                        (this,lhs,expr.field_2._M_local_buf + 0xf,expr.field_2._M_local_buf + 0xf,
                         (char (*) [2])0x6815db);
            }
            else {
              statement<std::__cxx11::string_const&,char_const(&)[2],char&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                        (this,lhs,(char (*) [2])0x645fd9,expr.field_2._M_local_buf + 0xf,
                         (char (*) [3])0x6766c5,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68,(char (*) [2])0x6815db);
            }
            this_local._7_1_ = true;
          }
          ::std::__cxx11::string::~string((string *)local_68);
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::optimize_read_modify_write(const SPIRType &type, const string &lhs, const string &rhs)
{
	// Do this with strings because we have a very clear pattern we can check for and it avoids
	// adding lots of special cases to the code emission.
	if (rhs.size() < lhs.size() + 3)
		return false;

	// Do not optimize matrices. They are a bit awkward to reason about in general
	// (in which order does operation happen?), and it does not work on MSL anyways.
	if (type.vecsize > 1 && type.columns > 1)
		return false;

	auto index = rhs.find(lhs);
	if (index != 0)
		return false;

	// TODO: Shift operators, but it's not important for now.
	auto op = rhs.find_first_of("+-/*%|&^", lhs.size() + 1);
	if (op != lhs.size() + 1)
		return false;

	// Check that the op is followed by space. This excludes && and ||.
	if (rhs[op + 1] != ' ')
		return false;

	char bop = rhs[op];
	auto expr = rhs.substr(lhs.size() + 3);

	// Avoids false positives where we get a = a * b + c.
	// Normally, these expressions are always enclosed, but unexpected code paths may end up hitting this.
	if (needs_enclose_expression(expr))
		return false;

	// Try to find increments and decrements. Makes it look neater as += 1, -= 1 is fairly rare to see in real code.
	// Find some common patterns which are equivalent.
	if ((bop == '+' || bop == '-') && (expr == "1" || expr == "uint(1)" || expr == "1u" || expr == "int(1u)"))
		statement(lhs, bop, bop, ";");
	else
		statement(lhs, " ", bop, "= ", expr, ";");
	return true;
}